

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

int __thiscall
TPZCompElHDiv<pzshape::TPZShapeCube>::PreferredSideOrder
          (TPZCompElHDiv<pzshape::TPZShapeCube> *this,int side)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  
  iVar1 = pztopology::TPZCube::SideDimension(side);
  iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0xb0))(this);
  if (iVar1 < iVar2 + -1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "virtual int TPZCompElHDiv<pzshape::TPZShapeCube>::PreferredSideOrder(int) [TSHAPE = pzshape::TPZShapeCube]"
                            );
    poVar3 = std::operator<<(poVar3," side ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,side);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x250))(this,0,side);
  if ((-1 < iVar1) &&
     (iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x90))(this), iVar1 <= iVar2)) {
    iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x90))(this);
    if (iVar1 < iVar2) {
      return (this->super_TPZIntelGen<pzshape::TPZShapeCube>).super_TPZInterpolatedElement.
             super_TPZInterpolationSpace.fPreferredOrder;
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "TPZCompElHDiv<TSHAPE>::PreferredSideOrder called for connect = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    std::operator<<(poVar3,"\n");
    return 0;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,
                           "TPZCompElHDiv<TSHAPE>::PreferredSideOrder no polynomial associate ");
  std::endl<char,std::char_traits<char>>(poVar3);
  return -1;
}

Assistant:

int TPZCompElHDiv<TSHAPE>::PreferredSideOrder(int side) {
	if(TSHAPE::SideDimension(side) < Dimension()-1)
	{
		PZError << __PRETTY_FUNCTION__ << " side " << side << std::endl;
	}
	int connect= SideConnectLocId(0,side);
	if(connect<0 || connect > NConnects()) {
		PZError << "TPZCompElHDiv<TSHAPE>::PreferredSideOrder no polynomial associate " <<  endl;
		return -1;
	}
	if(connect<NConnects()) {
			int order =this->fPreferredOrder;
			return order;//this->AdjustPreferredSideOrder(side,order);
	}
	PZError << "TPZCompElHDiv<TSHAPE>::PreferredSideOrder called for connect = " << connect << "\n";
	return 0;

}